

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::set(View *this,uint16_t member_index,double value)

{
  double value_local;
  uint16_t member_index_local;
  View *this_local;
  
  switch(member_index) {
  case 3:
    set_sln(this,value);
    break;
  case 4:
    set_res(this,value);
    break;
  case 7:
    set_act(this,value);
    break;
  case 8:
    set_vis(this,value);
  }
  return;
}

Assistant:

void View::set(uint16_t member_index, double value)
{
    switch (member_index) {
    case VIEW_SLN:
        set_sln(value);
        break;

    case VIEW_RES:
        set_res(value);
        break;

    case VIEW_ACT:
        set_act(value);
        break;

    case GRP_VIEW_VIS:
        set_vis(value);
        break;
    }
}